

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxDecoder.cpp
# Opt level: O1

int __thiscall FluxDecoder::flux_count(FluxDecoder *this)

{
  int iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  pointer pvVar2;
  
  iVar1 = 0;
  for (pvVar2 = (this->m_flux_revs->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar2 != (this->m_flux_revs->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
    iVar1 = iVar1 + (int)((ulong)((long)(pvVar2->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar2->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 2);
  }
  return iVar1;
}

Assistant:

int FluxDecoder::flux_count() const
{
    auto count = 0;

    for (const auto& vec : m_flux_revs)
        count += static_cast<int>(vec.size());

    return count;
}